

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio-logger.cpp
# Opt level: O3

bool __thiscall AudioLogger::install(AudioLogger *this,Parameters *parameters)

{
  _Head_base<0UL,_AudioLogger::Data_*,_false> _Var1;
  uint uVar2;
  ESampleType EVar3;
  EAudioFilter EVar4;
  float fVar5;
  int64_t iVar6;
  int iVar7;
  uint uVar8;
  undefined8 uVar9;
  char *__format;
  uint uVar10;
  ulong uVar11;
  SDL_AudioSpec obtainedSpec;
  SDL_AudioSpec captureSpec;
  uint local_a0;
  ushort local_9c;
  byte local_9a;
  ushort local_98;
  TFilterCoefficients local_7c;
  undefined4 local_50;
  undefined2 local_4c;
  undefined1 local_4a;
  undefined2 local_48;
  code *local_40;
  AudioLogger *local_38;
  
  if (parameters->captureId < 0) {
    __format = "error : invalid captureId = %d\n";
LAB_0013cbb1:
    fprintf(_stderr,__format);
    return false;
  }
  if (parameters->nChannels < 0) {
    __format = "error : invalid nChannels = %d\n";
    goto LAB_0013cbb1;
  }
  if (parameters->sampleRate < 1) {
    __format = "error : invalid sampleRate = %d\n";
    goto LAB_0013cbb1;
  }
  if (parameters->freqCutoff_Hz <= 0.0) {
    install(this);
    return false;
  }
  _Var1._M_head_impl =
       (this->data_)._M_t.
       super___uniq_ptr_impl<AudioLogger::Data,_std::default_delete<AudioLogger::Data>_>._M_t.
       super__Tuple_impl<0UL,_AudioLogger::Data_*,_std::default_delete<AudioLogger::Data>_>.
       super__Head_base<0UL,_AudioLogger::Data_*,_false>._M_head_impl;
  if ((install(AudioLogger::Parameters&&)::isInitialized == '\0') &&
     (iVar7 = SDL_Init(0x10), iVar7 < 0)) {
    uVar9 = SDL_GetError();
    SDL_LogError(0,"Couldn\'t initialize SDL: %s\n",uVar9);
    return false;
  }
  install(AudioLogger::Parameters&&)::isInitialized = '\x01';
  uVar8 = SDL_GetNumAudioDevices(1);
  printf("Found %d capture devices:\n",(ulong)uVar8);
  if (0 < (int)uVar8) {
    uVar11 = 0;
    do {
      uVar9 = SDL_GetAudioDeviceName(uVar11,1);
      printf("    - Capture device #%d: \'%s\'\n",uVar11,uVar9);
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar8 != uVar10);
  }
  iVar7 = parameters->captureId;
  if ((iVar7 < 0) || ((int)uVar8 <= iVar7)) {
    __format = "error : invalid capture device id selected - %d\n";
    goto LAB_0013cbb1;
  }
  SDL_memset(&local_50,0,0x20);
  local_50 = (undefined4)parameters->sampleRate;
  local_4c = 0x8120;
  local_4a = (undefined1)parameters->nChannels;
  local_48 = 0x200;
  local_40 = anon_unknown.dwarf_96766::cbAudioReady;
  local_38 = this;
  SDL_memset(&local_a0,0,0x20);
  uVar8 = parameters->captureId;
  uVar9 = SDL_GetAudioDeviceName(uVar8,1);
  printf("Attempt to open capture device %d : \'%s\' ...\n",(ulong)uVar8,uVar9);
  uVar9 = SDL_GetAudioDeviceName(parameters->captureId,1);
  uVar8 = SDL_OpenAudioDevice(uVar9,1,&local_50,&local_a0,4);
  (_Var1._M_head_impl)->deviceIdIn = uVar8;
  if (uVar8 == 0) {
    uVar9 = SDL_GetError();
    SDL_LogError(0,"Couldn\'t open an audio device for capture: %s!\n",uVar9);
    SDL_Quit();
    return false;
  }
  if (local_9c < 0x8120) {
    if ((((local_9c - 0x8008 < 0x19) && ((0x1000101U >> (local_9c - 0x8008 & 0x1f) & 1) != 0)) ||
        (local_9c == 8)) || (local_9c == 0x10)) {
      __format = "error : unsupported sample format %d\n";
      goto LAB_0013cbb1;
    }
  }
  else if (local_9c == 0x8120) {
    (_Var1._M_head_impl)->sampleSize_bytes = 4;
  }
  puts("Opened capture device succesfully!");
  printf("    DeviceId:   %d\n",(ulong)(_Var1._M_head_impl)->deviceIdIn);
  printf("    Frequency:  %d\n",(ulong)local_a0);
  printf("    Format:     %d (%d bytes)\n",(ulong)local_9c,
         (ulong)(uint)(_Var1._M_head_impl)->sampleSize_bytes);
  printf("    Channels:   %d\n",(ulong)local_9a);
  printf("    Samples:    %d\n",(ulong)local_98);
  if (parameters->nChannels != 0 && parameters->nChannels != (uint)local_9a) {
    printf("Warning: obtained number of channels (%d) does not match requested (%d)\n");
  }
  SDL_PauseAudioDevice((_Var1._M_head_impl)->deviceIdIn,0);
  parameters->nChannels = (uint)local_9a;
  if (parameters->filter == SecondOrderButterworthHighPass) {
    calculateCoefficientsSecondOrderButterworthHighPass
              (&local_7c,(int)parameters->freqCutoff_Hz,(int)parameters->sampleRate);
  }
  else {
    if (parameters->filter != FirstOrderHighPass) goto LAB_0013cadd;
    calculateCoefficientsFirstOrderHighPass
              (&local_7c,(int)parameters->freqCutoff_Hz,(int)parameters->sampleRate);
  }
  *(ulong *)((long)&(_Var1._M_head_impl)->filterCoefficients + 0x1c) =
       CONCAT44(local_7c.xnz2,local_7c.xnz1);
  *(undefined8 *)((long)&(_Var1._M_head_impl)->filterCoefficients + 0x24) = local_7c._36_8_;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->filterCoefficients + 0x10) = local_7c._16_8_;
  *(ulong *)((long)&(_Var1._M_head_impl)->filterCoefficients + 0x18) =
       CONCAT44(local_7c.xnz1,local_7c.d0);
  ((_Var1._M_head_impl)->filterCoefficients).a0 = local_7c.a0;
  ((_Var1._M_head_impl)->filterCoefficients).a1 = local_7c.a1;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->filterCoefficients + 8) = local_7c._8_8_;
LAB_0013cadd:
  std::
  function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
  ::operator=(&((_Var1._M_head_impl)->parameters).callback,&parameters->callback);
  uVar8 = parameters->nChannels;
  iVar6 = parameters->sampleRate;
  uVar10 = *(uint *)((long)&parameters->sampleRate + 4);
  uVar2 = *(uint *)((long)&parameters->sampleRate + 4);
  EVar3 = parameters->sampleType;
  EVar4 = parameters->filter;
  fVar5 = parameters->freqCutoff_Hz;
  *(int32_t *)((long)&(_Var1._M_head_impl)->parameters + 0x20) = parameters->captureId;
  *(uint *)((long)&(_Var1._M_head_impl)->parameters + 0x24) = uVar8;
  *(uint *)((long)&(_Var1._M_head_impl)->parameters + 0x28) = (uint)iVar6;
  *(uint *)((long)&(_Var1._M_head_impl)->parameters + 0x2c) = uVar10;
  *(uint *)((long)&(_Var1._M_head_impl)->parameters + 0x2c) = uVar2;
  *(ESampleType *)((long)&(_Var1._M_head_impl)->parameters + 0x30) = EVar3;
  *(EAudioFilter *)((long)&(_Var1._M_head_impl)->parameters + 0x34) = EVar4;
  *(float *)((long)&(_Var1._M_head_impl)->parameters + 0x38) = fVar5;
  LOCK();
  ((_Var1._M_head_impl)->isReady)._M_base = (__atomic_base<bool>)0x1;
  UNLOCK();
  printf("    Audio Filter: %d\n",(ulong)parameters->filter);
  printf("    Cutoff frequency: %g Hz\n",SUB84((double)parameters->freqCutoff_Hz,0));
  puts("Capturing audio ..");
  return true;
}

Assistant:

bool AudioLogger::install(Parameters && parameters) {
    auto & data = getData();

    if (parameters.captureId < 0) {
        fprintf(stderr, "error : invalid captureId = %d\n", parameters.captureId);
        return false;
    }

    if (parameters.nChannels < 0) {
        fprintf(stderr, "error : invalid nChannels = %d\n", parameters.nChannels);
        return false;
    }

    if (parameters.sampleRate <= 0) {
        fprintf(stderr, "error : invalid sampleRate = %d\n", (int) parameters.sampleRate);
        return false;
    }

    if (parameters.freqCutoff_Hz <= 0) {
        fprintf(stderr, "error : invalid freqCutoff_Hz = %g\n", parameters.freqCutoff_Hz);
        return false;
    }

    static bool isInitialized = false;
    if (!isInitialized && SDL_Init(SDL_INIT_AUDIO) < 0) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s\n", SDL_GetError());
        return false;
    }
    isInitialized = true;

    int nDevices = SDL_GetNumAudioDevices(SDL_TRUE);
    printf("Found %d capture devices:\n", nDevices);
    for (int i = 0; i < nDevices; i++) {
        printf("    - Capture device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_TRUE));
    }

    if (parameters.captureId < 0 || parameters.captureId >= nDevices) {
        fprintf(stderr, "error : invalid capture device id selected - %d\n", parameters.captureId);
        return false;
    }

    SDL_AudioSpec captureSpec;
    SDL_zero(captureSpec);

    captureSpec.freq = parameters.sampleRate;
    captureSpec.format = AUDIO_F32SYS;
    captureSpec.channels = parameters.nChannels;
    captureSpec.samples = kSamplesPerFrame;
    captureSpec.callback = ::cbAudioReady;
    captureSpec.userdata = this;

    SDL_AudioSpec obtainedSpec;
    SDL_zero(obtainedSpec);

    printf("Attempt to open capture device %d : '%s' ...\n", parameters.captureId, SDL_GetAudioDeviceName(parameters.captureId, SDL_TRUE));
    data.deviceIdIn = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(parameters.captureId, SDL_TRUE), SDL_TRUE, &captureSpec, &obtainedSpec, SDL_AUDIO_ALLOW_CHANNELS_CHANGE);
    if (!data.deviceIdIn) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't open an audio device for capture: %s!\n", SDL_GetError());
        SDL_Quit();
        return false;
    }

    switch (obtainedSpec.format) {
        case AUDIO_U8:
        case AUDIO_S8:
        case AUDIO_U16SYS:
        case AUDIO_S16SYS:
        case AUDIO_S32SYS:
            {
                fprintf(stderr, "error : unsupported sample format %d\n", obtainedSpec.format);
                return false;
            }
            break;
        case AUDIO_F32SYS:
            {
                data.sampleSize_bytes = 4;
            }
            break;
    }

    printf("Opened capture device succesfully!\n");
    printf("    DeviceId:   %d\n", data.deviceIdIn);
    printf("    Frequency:  %d\n", obtainedSpec.freq);
    printf("    Format:     %d (%d bytes)\n", obtainedSpec.format, data.sampleSize_bytes);
    printf("    Channels:   %d\n", obtainedSpec.channels);
    printf("    Samples:    %d\n", obtainedSpec.samples);

    if (obtainedSpec.channels != parameters.nChannels && parameters.nChannels != 0) {
        printf("Warning: obtained number of channels (%d) does not match requested (%d)\n",
               obtainedSpec.channels, parameters.nChannels);
    }

    SDL_PauseAudioDevice(data.deviceIdIn, 0);

    parameters.nChannels = obtainedSpec.channels;

    switch (parameters.filter) {
        case EAudioFilter::None:
            {
            }
            break;
        case EAudioFilter::FirstOrderHighPass:
            {
                data.filterCoefficients = ::calculateCoefficientsFirstOrderHighPass(parameters.freqCutoff_Hz, parameters.sampleRate);
            }
            break;
        case EAudioFilter::SecondOrderButterworthHighPass:
            {
                data.filterCoefficients = ::calculateCoefficientsSecondOrderButterworthHighPass(parameters.freqCutoff_Hz, parameters.sampleRate);
            }
            break;
    };

    data.parameters = parameters;
    data.isReady = true;

    // print filter paramters
    printf("    Audio Filter: %d\n", parameters.filter);
    printf("    Cutoff frequency: %g Hz\n", parameters.freqCutoff_Hz);
    printf("Capturing audio ..\n");

    return true;
}